

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall
CTcTokenizer::enum_defines(CTcTokenizer *this,_func_void_void_ptr_CTcHashEntryPp_ptr *cb,void *ctx)

{
  long in_RDI;
  def_enum_cb_t myctx;
  undefined1 local_28 [40];
  
  (**(code **)(**(long **)(in_RDI + 0xd30) + 0x28))
            (*(long **)(in_RDI + 0xd30),enum_defines_cb,local_28);
  return;
}

Assistant:

void CTcTokenizer::enum_defines(void (*cb)(void *, CTcHashEntryPp *),
                                void *ctx)
{
    def_enum_cb_t myctx;

    /* set up our impedence-matcher context with the real callback info */
    myctx.cb = cb;
    myctx.ctx = ctx;

    /* enumerate through our impedence-matcher callback */
    defines_->enum_entries(&enum_defines_cb, &myctx);
}